

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyBalance.c
# Opt level: O1

Ivy_Obj_t *
Ivy_NodeBalanceBuildSuper(Ivy_Man_t *p,Vec_Ptr_t *vSuper,Ivy_Type_t Type,int fUpdateLevel)

{
  uint uVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pIVar3;
  void *pvVar4;
  bool bVar5;
  uint uVar6;
  Ivy_Obj_t *pIVar7;
  Ivy_Obj_t *pIVar8;
  void **ppvVar9;
  int iVar10;
  long lVar11;
  Ivy_Obj_t *pIVar12;
  uint uVar13;
  ulong uVar14;
  
  if ((long)vSuper->nSize < 2) {
    __assert_fail("vSuper->nSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyBalance.c"
                  ,0xb3,
                  "Ivy_Obj_t *Ivy_NodeBalanceBuildSuper(Ivy_Man_t *, Vec_Ptr_t *, Ivy_Type_t, int)")
    ;
  }
  qsort(vSuper->pArray,(long)vSuper->nSize,8,Ivy_NodeCompareLevelsDecrease);
  uVar6 = vSuper->nSize;
  if (1 < (int)uVar6) {
    do {
      uVar13 = 0;
      if (uVar6 != 2 && fUpdateLevel != 0) {
        ppvVar9 = vSuper->pArray;
        uVar1 = *(uint *)(((ulong)ppvVar9[(ulong)uVar6 - 2] & 0xfffffffffffffffe) + 8);
        uVar14 = (ulong)(uVar6 - 3);
        do {
          if (0x7ff < (*(uint *)(((ulong)ppvVar9[uVar14] & 0xfffffffffffffffe) + 8) ^ uVar1))
          goto LAB_0091b9c8;
          bVar5 = 0 < (long)uVar14;
          uVar14 = uVar14 - 1;
        } while (bVar5);
        uVar14 = 0xffffffff;
LAB_0091b9c8:
        if (((int)uVar14 < -1) || (uVar13 = (int)uVar14 + 1, (int)uVar6 <= (int)uVar13))
        goto LAB_0091bcc8;
        if (0x7ff < (uVar1 ^ *(uint *)(((ulong)ppvVar9[uVar13] & 0xfffffffffffffffe) + 8))) {
          __assert_fail("Ivy_Regular(pObjLeft)->Level == Ivy_Regular(pObjRight)->Level",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyBalance.c"
                        ,0x13b,"int Ivy_NodeBalanceFindLeft(Vec_Ptr_t *)");
        }
      }
      uVar1 = uVar6 - 2;
      if ((int)uVar1 < (int)uVar13) {
        __assert_fail("LeftBound <= RightBound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyBalance.c"
                      ,0x151,"void Ivy_NodeBalancePermute(Ivy_Man_t *, Vec_Ptr_t *, int, int)");
      }
      if (uVar1 != uVar13) {
        pIVar8 = (Ivy_Obj_t *)vSuper->pArray[(ulong)uVar6 - 1];
        pIVar12 = (Ivy_Obj_t *)((ulong)pIVar8 & 0xfffffffffffffffe);
        if (p->pConst1 != pIVar12) {
          pIVar2 = (Ivy_Obj_t *)vSuper->pArray[uVar1];
          uVar6 = uVar1;
          if (p->pConst1 != (Ivy_Obj_t *)((ulong)pIVar2 & 0xfffffffffffffffe)) {
            do {
              if (((int)uVar6 < 0) || (iVar10 = vSuper->nSize, iVar10 <= (int)uVar6))
              goto LAB_0091bcc8;
              pIVar3 = (Ivy_Obj_t *)vSuper->pArray[uVar6];
              pIVar7 = (Ivy_Obj_t *)((ulong)pIVar3 & 0xfffffffffffffffe);
              if (p->pConst1 == pIVar7) {
                vSuper->pArray[uVar6] = pIVar2;
joined_r0x0091bb23:
                if (iVar10 <= (int)uVar1) {
LAB_0091bda1:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                }
                vSuper->pArray[uVar1] = pIVar3;
                break;
              }
              if ((Type != IVY_EXOR) && (pIVar12->Id == 0)) {
                __assert_fail("Type != IVY_AND || !Ivy_ObjIsConst1(Ivy_Regular(p0))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivy.h"
                              ,0x137,
                              "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                             );
              }
              if ((pIVar3 != (Ivy_Obj_t *)0x0) && (pIVar7->Id == 0)) {
                __assert_fail("p1 == NULL || !Ivy_ObjIsConst1(Ivy_Regular(p1))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivy.h"
                              ,0x138,
                              "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                             );
              }
              if (pIVar12 == pIVar7) {
                __assert_fail("Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivy.h"
                              ,0x139,
                              "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                             );
              }
              *(uint *)&(p->Ghost).field_0x8 =
                   (*(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0) + (Type == IVY_EXOR) + 5;
              (p->Ghost).pFanin0 = pIVar8;
              (p->Ghost).pFanin1 = pIVar3;
              if (pIVar3 != (Ivy_Obj_t *)0x0) {
                if (pIVar8 == (Ivy_Obj_t *)0x0) {
                  iVar10 = 0;
                }
                else {
                  iVar10 = pIVar12->Id;
                }
                if (pIVar7->Id < iVar10) {
                  (p->Ghost).pFanin0 = pIVar3;
                  (p->Ghost).pFanin1 = pIVar8;
                }
              }
              pIVar7 = Ivy_TableLookup(p,&p->Ghost);
              if (pIVar7 != (Ivy_Obj_t *)0x0) {
                if (pIVar3 != pIVar2) {
                  iVar10 = vSuper->nSize;
                  if (iVar10 <= (int)uVar6) goto LAB_0091bda1;
                  vSuper->pArray[uVar6] = pIVar2;
                  goto joined_r0x0091bb23;
                }
                break;
              }
              bVar5 = (int)uVar13 < (int)uVar6;
              uVar6 = uVar6 - 1;
            } while (bVar5);
          }
        }
      }
      iVar10 = vSuper->nSize;
      if (iVar10 < 1) {
LAB_0091bd06:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x2e6,"void *Vec_PtrPop(Vec_Ptr_t *)");
      }
      vSuper->nSize = iVar10 - 1U;
      if (iVar10 == 1) goto LAB_0091bd06;
      pIVar8 = (Ivy_Obj_t *)vSuper->pArray[iVar10 - 1U];
      vSuper->nSize = iVar10 - 2U;
      pIVar8 = Ivy_Oper(p,pIVar8,(Ivy_Obj_t *)vSuper->pArray[iVar10 - 2U],Type);
      uVar6 = vSuper->nSize;
      if (0 < (long)(int)uVar6) {
        lVar11 = 0;
        do {
          if ((Ivy_Obj_t *)vSuper->pArray[lVar11] == pIVar8) goto LAB_0091bc8d;
          lVar11 = lVar11 + 1;
        } while ((int)uVar6 != lVar11);
      }
      uVar13 = vSuper->nCap;
      if (uVar6 == uVar13) {
        if ((int)uVar13 < 0x10) {
          if (vSuper->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(vSuper->pArray,0x80);
          }
          iVar10 = 0x10;
        }
        else {
          iVar10 = uVar13 * 2;
          if (iVar10 <= (int)uVar13) goto LAB_0091bc28;
          if (vSuper->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar13 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(vSuper->pArray,(ulong)uVar13 << 4);
          }
        }
        vSuper->pArray = ppvVar9;
        vSuper->nCap = iVar10;
      }
LAB_0091bc28:
      uVar14 = (ulong)vSuper->nSize;
      uVar6 = vSuper->nSize + 1;
      vSuper->nSize = uVar6;
      vSuper->pArray[uVar14] = pIVar8;
      if (0 < (long)uVar14) {
        lVar11 = (ulong)uVar6 - 2;
        do {
          ppvVar9 = vSuper->pArray;
          pvVar4 = ppvVar9[uVar14 & 0xffffffff];
          if (*(uint *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 8) >> 0xb <=
              *(uint *)(((ulong)ppvVar9[lVar11] & 0xfffffffffffffffe) + 8) >> 0xb) break;
          ppvVar9[uVar14 & 0xffffffff] = ppvVar9[lVar11];
          vSuper->pArray[lVar11] = pvVar4;
          iVar10 = (int)uVar14;
          uVar14 = (ulong)(iVar10 - 1);
          lVar11 = lVar11 + -1;
        } while (1 < iVar10);
      }
LAB_0091bc8d:
      uVar6 = vSuper->nSize;
    } while (1 < (int)uVar6);
  }
  if (uVar6 == 1) {
    return (Ivy_Obj_t *)*vSuper->pArray;
  }
LAB_0091bcc8:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Ivy_Obj_t * Ivy_NodeBalanceBuildSuper( Ivy_Man_t * p, Vec_Ptr_t * vSuper, Ivy_Type_t Type, int fUpdateLevel )
{
    Ivy_Obj_t * pObj1, * pObj2;
    int LeftBound;
    assert( vSuper->nSize > 1 );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Ivy_NodeCompareLevelsDecrease );
    // balance the nodes
    while ( vSuper->nSize > 1 )
    {
        // find the left bound on the node to be paired
        LeftBound = (!fUpdateLevel)? 0 : Ivy_NodeBalanceFindLeft( vSuper );
        // find the node that can be shared (if no such node, randomize choice)
        Ivy_NodeBalancePermute( p, vSuper, LeftBound, Type == IVY_EXOR );
        // pull out the last two nodes
        pObj1 = (Ivy_Obj_t *)Vec_PtrPop(vSuper);
        pObj2 = (Ivy_Obj_t *)Vec_PtrPop(vSuper);
        Ivy_NodeBalancePushUniqueOrderByLevel( vSuper, Ivy_Oper(p, pObj1, pObj2, Type) );
    }
    return (Ivy_Obj_t *)Vec_PtrEntry(vSuper, 0);
}